

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

void __thiscall Mat::Mat(Mat *this,Mat *A,Mat *B)

{
  double dVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  double *pdVar4;
  int local_24;
  int i;
  Mat *B_local;
  Mat *A_local;
  Mat *this_local;
  
  this->n_rows_ = A->n_rows_ + B->n_rows_;
  this->n_cols_ = A->n_cols_;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)this->n_rows_;
  uVar3 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pdVar4 = (double *)operator_new__(uVar3);
  this->v_ = pdVar4;
  for (local_24 = 0; local_24 < A->n_rows_; local_24 = local_24 + 1) {
    this->v_[local_24] = A->v_[local_24];
  }
  for (local_24 = 0; local_24 < B->n_rows_; local_24 = local_24 + 1) {
    dVar1 = B->v_[local_24];
    pdVar4 = operator()(this,local_24 + B->n_rows_);
    *pdVar4 = dVar1;
  }
  return;
}

Assistant:

Mat::Mat(const Mat &A, const Mat &B)
{
	n_rows_ = A.n_rows_ + B.n_rows_;
	n_cols_ = A.n_cols_;
	v_ = new double [n_rows_];
	int i;
	for (i=0; i<A.n_rows_; i++)
		v_[i]=A.v_[i];
	for (i=0; i<B.n_rows_; i++)
		(*this)(i+B.n_rows_)=B.v_[i];
}